

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::removeBeginAndEndInstructionsFromFunction
          (InvocationInterlockPlacementPass *this,Function *func)

{
  bool modified;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = &modified;
  modified = false;
  local_10 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:172:21)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:172:21)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  opt::Function::ForEachInst
            (func,(function<void_(spvtools::opt::Instruction_*)> *)&local_28,false,false);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return modified;
}

Assistant:

bool InvocationInterlockPlacementPass::
    removeBeginAndEndInstructionsFromFunction(Function* func) {
  bool modified = false;
  func->ForEachInst([this, &modified](Instruction* inst) {
    switch (inst->opcode()) {
      case spv::Op::OpBeginInvocationInterlockEXT:
        context()->KillInst(inst);
        modified = true;
        break;
      case spv::Op::OpEndInvocationInterlockEXT:
        context()->KillInst(inst);
        modified = true;
        break;
      default:
        break;
    }
  });
  return modified;
}